

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

void transpose64Simple(word *A,word *B)

{
  int local_20;
  int local_1c;
  int k;
  int i;
  word *B_local;
  word *A_local;
  
  for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 1) {
    B[local_1c] = 0;
  }
  for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 0x40; local_20 = local_20 + 1) {
      if ((A[local_1c] >> ((byte)local_20 & 0x3f) & 1) != 0) {
        B[local_20] = 1L << (0x3fU - (char)local_1c & 0x3f) | B[local_20];
      }
    }
  }
  return;
}

Assistant:

void transpose64Simple( word A[64], word B[64] )
{
    int i, k;
    for ( i = 0; i < 64; i++ )
        B[i] = 0;
    for ( i = 0; i < 64; i++ )
    for ( k = 0; k < 64; k++ )
        if ( (A[i] >> k) & 1 )
            B[k] |= ((word)1 << (63-i));
}